

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_reverse(char *s,ssize_t i,ssize_t j)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar6 = 0;
    lVar7 = 0;
  }
  else {
    lVar4 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar4) {
      lVar4 = sVar1 - 1;
    }
    lVar7 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar7) {
      lVar7 = sVar1 - 1;
    }
    lVar6 = lVar7;
    if (lVar7 < lVar4) {
      lVar6 = lVar4;
    }
    if (lVar4 < lVar7) {
      lVar7 = lVar4;
    }
  }
  lVar2 = lVar7 - lVar6;
  lVar4 = -lVar2;
  if (0 < lVar2) {
    lVar4 = lVar2;
  }
  pcVar3 = (char *)zt_malloc_p(lVar4 + 2);
  lVar6 = lVar6 + 1;
  pcVar5 = pcVar3;
  do {
    *pcVar5 = s[lVar6 + -1];
    pcVar5 = pcVar5 + 1;
    lVar6 = lVar6 + -1;
  } while (lVar7 < lVar6);
  *pcVar5 = '\0';
  return pcVar3;
}

Assistant:

char *
zt_cstr_reverse(const char *s, ssize_t i, ssize_t j) {
    char * new;
    char * p;

    CONVERT(s, i, j);

    p = new = zt_malloc(char, IDXLEN(i, j) + 1);

    while (i <= j) {
        *p++ = s[j--];
    }

    *p = '\0';
    return new;
}